

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::NEG_OP(SQVM *this,SQObjectPtr *trg,SQObjectPtr *o)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  SQObjectValue SVar3;
  bool bVar4;
  int iVar5;
  SQChar *pSVar6;
  SQMetaMethod mm;
  byte unaff_R12B;
  SQObjectPtr closure;
  
  SVar1 = (o->super_SQObject)._type;
  if (SVar1 == OT_INSTANCE) {
LAB_0011a2eb:
    pSVar2 = (o->super_SQObject)._unVal.pTable;
    if ((pSVar2->super_SQDelegable)._delegate != (SQTable *)0x0) {
      closure.super_SQObject._type = OT_NULL;
      closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
      iVar5 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[6])(pSVar2,this,4);
      if ((char)iVar5 != '\0') {
        Push(this,o);
        bVar4 = CallMetaMethod(this,&closure,mm,1,&this->temp_reg);
        if (bVar4) {
          SVar1 = (trg->super_SQObject)._type;
          SVar3 = (trg->super_SQObject)._unVal;
          (trg->super_SQObject)._type = (this->temp_reg).super_SQObject._type;
          (trg->super_SQObject)._unVal = (this->temp_reg).super_SQObject._unVal;
          (this->temp_reg).super_SQObject._type = SVar1;
          (this->temp_reg).super_SQObject._unVal = SVar3;
          unaff_R12B = 1;
        }
        else {
          unaff_R12B = 0;
        }
      }
      SQObjectPtr::~SQObjectPtr(&closure);
      if ((char)iVar5 != '\0') goto LAB_0011a3b4;
    }
  }
  else {
    if (SVar1 == OT_FLOAT) {
      SQObjectPtr::operator=(trg,-(o->super_SQObject)._unVal.fFloat);
LAB_0011a380:
      unaff_R12B = 1;
      goto LAB_0011a3b4;
    }
    if ((SVar1 == OT_TABLE) || (SVar1 == OT_USERDATA)) goto LAB_0011a2eb;
    if (SVar1 == OT_INTEGER) {
      SQObjectPtr::operator=(trg,-(o->super_SQObject)._unVal.nInteger);
      goto LAB_0011a380;
    }
  }
  pSVar6 = GetTypeName(o);
  unaff_R12B = 0;
  Raise_Error(this,"attempt to negate a %s",pSVar6);
LAB_0011a3b4:
  return (bool)(unaff_R12B & 1);
}

Assistant:

bool SQVM::NEG_OP(SQObjectPtr &trg,const SQObjectPtr &o)
{

    switch(sq_type(o)) {
    case OT_INTEGER:
        trg = -_integer(o);
        return true;
    case OT_FLOAT:
        trg = -_float(o);
        return true;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_UNM, closure)) {
                Push(o);
                if(!CallMetaMethod(closure, MT_UNM, 1, temp_reg)) return false;
                _Swap(trg,temp_reg);
                return true;

            }
        }
    default:break; //shutup compiler
    }
    Raise_Error(_SC("attempt to negate a %s"), GetTypeName(o));
    return false;
}